

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

void uv__signal_stop(uv_signal_t *handle)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  uv__signal_tree_s uVar5;
  int iVar6;
  uv_signal_s *puVar7;
  uv_signal_t *puVar8;
  uv__signal_tree_s uVar9;
  uv_signal_s *puVar10;
  uv_signal_s *puVar11;
  uv_signal_s *old;
  anon_struct_32_4_548b78d9_for_tree_entry *paVar12;
  uv_signal_s *puVar13;
  uv_signal_s *puVar14;
  sigset_t saved_sigmask;
  sigaction local_b0;
  
  if (handle->signum == 0) {
    return;
  }
  uv__signal_block_and_lock(&saved_sigmask);
  puVar13 = (handle->tree_entry).rbe_left;
  puVar7 = (handle->tree_entry).rbe_right;
  if (puVar13 == (uv_signal_s *)0x0) {
    puVar11 = (handle->tree_entry).rbe_parent;
    iVar6 = (handle->tree_entry).rbe_color;
    if (puVar7 != (uv_signal_s *)0x0) goto LAB_003be29b;
    puVar7 = (uv_signal_s *)0x0;
  }
  else {
    if (puVar7 != (uv_signal_s *)0x0) {
      do {
        puVar13 = puVar7;
        puVar7 = (puVar13->tree_entry).rbe_left;
      } while (puVar7 != (uv_signal_s *)0x0);
      puVar7 = (puVar13->tree_entry).rbe_right;
      puVar11 = (puVar13->tree_entry).rbe_parent;
      iVar6 = (puVar13->tree_entry).rbe_color;
      if (puVar7 != (uv_signal_s *)0x0) {
        (puVar7->tree_entry).rbe_parent = puVar11;
      }
      paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
      if (puVar11 != (uv_signal_s *)0x0) {
        paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar11->tree_entry).rbe_right;
        if ((puVar11->tree_entry).rbe_left == puVar13) {
          paVar12 = &puVar11->tree_entry;
        }
      }
      paVar12->rbe_left = puVar7;
      if ((puVar13->tree_entry).rbe_parent == handle) {
        puVar11 = puVar13;
      }
      puVar10 = (handle->tree_entry).rbe_left;
      puVar14 = (handle->tree_entry).rbe_right;
      iVar3 = (handle->tree_entry).rbe_color;
      uVar4 = *(undefined4 *)&(handle->tree_entry).field_0x1c;
      (puVar13->tree_entry).rbe_parent = (handle->tree_entry).rbe_parent;
      (puVar13->tree_entry).rbe_color = iVar3;
      *(undefined4 *)&(puVar13->tree_entry).field_0x1c = uVar4;
      (puVar13->tree_entry).rbe_left = puVar10;
      (puVar13->tree_entry).rbe_right = puVar14;
      puVar10 = (handle->tree_entry).rbe_parent;
      paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
      if (puVar10 != (uv_signal_s *)0x0) {
        paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar10->tree_entry).rbe_right;
        if ((puVar10->tree_entry).rbe_left == handle) {
          paVar12 = &puVar10->tree_entry;
        }
      }
      paVar12->rbe_left = puVar13;
      (((handle->tree_entry).rbe_left)->tree_entry).rbe_parent = puVar13;
      puVar10 = (handle->tree_entry).rbe_right;
      if (puVar10 != (uv_signal_s *)0x0) {
        (puVar10->tree_entry).rbe_parent = puVar13;
      }
      goto LAB_003be2c7;
    }
    puVar11 = (handle->tree_entry).rbe_parent;
    iVar6 = (handle->tree_entry).rbe_color;
    puVar7 = puVar13;
LAB_003be29b:
    (puVar7->tree_entry).rbe_parent = puVar11;
  }
  if (puVar11 == (uv_signal_s *)0x0) {
    paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
  }
  else {
    paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar11->tree_entry).rbe_right;
    if ((puVar11->tree_entry).rbe_left == handle) {
      paVar12 = &puVar11->tree_entry;
    }
  }
  paVar12->rbe_left = puVar7;
LAB_003be2c7:
  uVar9.rbh_root = uv__signal_tree.rbh_root;
  if (iVar6 == 0) {
    while( true ) {
      if (puVar7 == (uv_signal_s *)0x0) {
        if (uVar9.rbh_root == (uv_signal_s *)0x0) goto LAB_003be650;
      }
      else if (((puVar7->tree_entry).rbe_color != 0) || (puVar7 == uVar9.rbh_root))
      goto LAB_003be649;
      puVar13 = (puVar11->tree_entry).rbe_left;
      puVar10 = uVar9.rbh_root;
      if (puVar13 == puVar7) {
        puVar13 = (puVar11->tree_entry).rbe_right;
        puVar7 = puVar13;
        if ((puVar13->tree_entry).rbe_color == 1) {
          (puVar13->tree_entry).rbe_color = 0;
          (puVar11->tree_entry).rbe_color = 1;
          puVar7 = (puVar13->tree_entry).rbe_left;
          (puVar11->tree_entry).rbe_right = puVar7;
          if (puVar7 != (uv_signal_s *)0x0) {
            (puVar7->tree_entry).rbe_parent = puVar11;
          }
          puVar14 = (puVar11->tree_entry).rbe_parent;
          (puVar13->tree_entry).rbe_parent = puVar14;
          puVar10 = puVar13;
          uVar5.rbh_root = puVar13;
          if (puVar14 != (uv_signal_s *)0x0) {
            if (puVar11 == (puVar14->tree_entry).rbe_left) {
              (puVar14->tree_entry).rbe_left = puVar13;
              puVar10 = uVar9.rbh_root;
              uVar5 = uv__signal_tree;
            }
            else {
              (puVar14->tree_entry).rbe_right = puVar13;
              puVar7 = (puVar11->tree_entry).rbe_right;
              puVar10 = uVar9.rbh_root;
              uVar5 = uv__signal_tree;
            }
          }
          uv__signal_tree.rbh_root = uVar5.rbh_root;
          (puVar13->tree_entry).rbe_left = puVar11;
          (puVar11->tree_entry).rbe_parent = puVar13;
        }
        puVar13 = (puVar7->tree_entry).rbe_left;
        if ((puVar13 == (uv_signal_s *)0x0) || ((puVar13->tree_entry).rbe_color == 0)) {
          puVar14 = (puVar7->tree_entry).rbe_right;
          if ((puVar14 == (uv_signal_s *)0x0) || ((puVar14->tree_entry).rbe_color == 0))
          goto LAB_003be44a;
        }
        else {
          puVar14 = (puVar7->tree_entry).rbe_right;
          if ((puVar14 == (uv_signal_s *)0x0) || ((puVar14->tree_entry).rbe_color == 0)) {
            (puVar13->tree_entry).rbe_color = 0;
            (puVar7->tree_entry).rbe_color = 1;
            puVar14 = (puVar13->tree_entry).rbe_right;
            (puVar7->tree_entry).rbe_left = puVar14;
            if (puVar14 != (uv_signal_s *)0x0) {
              (puVar14->tree_entry).rbe_parent = puVar7;
            }
            puVar14 = (puVar7->tree_entry).rbe_parent;
            (puVar13->tree_entry).rbe_parent = puVar14;
            if (puVar14 == (uv_signal_s *)0x0) {
              puVar10 = puVar13;
              paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
            }
            else {
              paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar14->tree_entry).rbe_right
              ;
              if (puVar7 == (puVar14->tree_entry).rbe_left) {
                paVar12 = &puVar14->tree_entry;
              }
            }
            paVar12->rbe_left = puVar13;
            (puVar13->tree_entry).rbe_right = puVar7;
            (puVar7->tree_entry).rbe_parent = puVar13;
            puVar7 = (puVar11->tree_entry).rbe_right;
            puVar14 = (puVar7->tree_entry).rbe_right;
          }
        }
        (puVar7->tree_entry).rbe_color = (puVar11->tree_entry).rbe_color;
        (puVar11->tree_entry).rbe_color = 0;
        if (puVar14 != (uv_signal_s *)0x0) {
          (puVar14->tree_entry).rbe_color = 0;
        }
        puVar13 = (puVar7->tree_entry).rbe_left;
        (puVar11->tree_entry).rbe_right = puVar13;
        if (puVar13 != (uv_signal_s *)0x0) {
          (puVar13->tree_entry).rbe_parent = puVar11;
        }
        puVar13 = (puVar11->tree_entry).rbe_parent;
        (puVar7->tree_entry).rbe_parent = puVar13;
        if (puVar13 == (uv_signal_s *)0x0) {
          puVar10 = puVar7;
          paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
        }
        else {
          paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar13->tree_entry).rbe_right;
          if (puVar11 == (puVar13->tree_entry).rbe_left) {
            paVar12 = &puVar13->tree_entry;
          }
        }
        paVar12->rbe_left = puVar7;
        (puVar7->tree_entry).rbe_left = puVar11;
        goto LAB_003be63a;
      }
      puVar7 = puVar13;
      if ((puVar13->tree_entry).rbe_color == 1) {
        (puVar13->tree_entry).rbe_color = 0;
        (puVar11->tree_entry).rbe_color = 1;
        puVar7 = (puVar13->tree_entry).rbe_right;
        (puVar11->tree_entry).rbe_left = puVar7;
        if (puVar7 != (uv_signal_s *)0x0) {
          (puVar7->tree_entry).rbe_parent = puVar11;
        }
        puVar14 = (puVar11->tree_entry).rbe_parent;
        (puVar13->tree_entry).rbe_parent = puVar14;
        puVar10 = puVar13;
        uVar5.rbh_root = puVar13;
        if (puVar14 != (uv_signal_s *)0x0) {
          if (puVar11 == (puVar14->tree_entry).rbe_left) {
            (puVar14->tree_entry).rbe_left = puVar13;
            puVar7 = (puVar11->tree_entry).rbe_left;
            puVar10 = uVar9.rbh_root;
            uVar5 = uv__signal_tree;
          }
          else {
            (puVar14->tree_entry).rbe_right = puVar13;
            puVar10 = uVar9.rbh_root;
            uVar5 = uv__signal_tree;
          }
        }
        uv__signal_tree.rbh_root = uVar5.rbh_root;
        (puVar13->tree_entry).rbe_right = puVar11;
        (puVar11->tree_entry).rbe_parent = puVar13;
      }
      puVar13 = (puVar7->tree_entry).rbe_left;
      if ((puVar13 != (uv_signal_s *)0x0) && ((puVar13->tree_entry).rbe_color != 0))
      goto LAB_003be543;
      puVar14 = (puVar7->tree_entry).rbe_right;
      if ((puVar14 != (uv_signal_s *)0x0) && ((puVar14->tree_entry).rbe_color != 0)) break;
LAB_003be44a:
      (puVar7->tree_entry).rbe_color = 1;
      puVar7 = puVar11;
      uVar9.rbh_root = puVar10;
      puVar11 = (puVar11->tree_entry).rbe_parent;
    }
    if ((puVar13 == (uv_signal_s *)0x0) || ((puVar13->tree_entry).rbe_color == 0)) {
      (puVar14->tree_entry).rbe_color = 0;
      (puVar7->tree_entry).rbe_color = 1;
      puVar13 = (puVar14->tree_entry).rbe_left;
      (puVar7->tree_entry).rbe_right = puVar13;
      if (puVar13 != (uv_signal_s *)0x0) {
        (puVar13->tree_entry).rbe_parent = puVar7;
      }
      puVar13 = (puVar7->tree_entry).rbe_parent;
      (puVar14->tree_entry).rbe_parent = puVar13;
      if (puVar13 == (uv_signal_s *)0x0) {
        puVar10 = puVar14;
        paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
      }
      else {
        paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar13->tree_entry).rbe_right;
        if (puVar7 == (puVar13->tree_entry).rbe_left) {
          paVar12 = &puVar13->tree_entry;
        }
      }
      paVar12->rbe_left = puVar14;
      (puVar14->tree_entry).rbe_left = puVar7;
      (puVar7->tree_entry).rbe_parent = puVar14;
      puVar7 = (puVar11->tree_entry).rbe_left;
      puVar13 = (puVar7->tree_entry).rbe_left;
    }
LAB_003be543:
    (puVar7->tree_entry).rbe_color = (puVar11->tree_entry).rbe_color;
    (puVar11->tree_entry).rbe_color = 0;
    if (puVar13 != (uv_signal_s *)0x0) {
      (puVar13->tree_entry).rbe_color = 0;
    }
    puVar13 = (puVar7->tree_entry).rbe_right;
    (puVar11->tree_entry).rbe_left = puVar13;
    if (puVar13 != (uv_signal_s *)0x0) {
      (puVar13->tree_entry).rbe_parent = puVar11;
    }
    puVar13 = (puVar11->tree_entry).rbe_parent;
    (puVar7->tree_entry).rbe_parent = puVar13;
    if (puVar13 == (uv_signal_s *)0x0) {
      puVar10 = puVar7;
      paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
    }
    else {
      paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar13->tree_entry).rbe_right;
      if (puVar11 == (puVar13->tree_entry).rbe_left) {
        paVar12 = &puVar13->tree_entry;
      }
    }
    paVar12->rbe_left = puVar7;
    (puVar7->tree_entry).rbe_right = puVar11;
LAB_003be63a:
    (puVar11->tree_entry).rbe_parent = puVar7;
    puVar7 = puVar10;
    if (puVar10 != (uv_signal_s *)0x0) {
LAB_003be649:
      (puVar7->tree_entry).rbe_color = 0;
    }
  }
LAB_003be650:
  iVar6 = handle->signum;
  puVar8 = uv__signal_first_handle(iVar6);
  if (puVar8 == (uv_signal_t *)0x0) {
    memset(&local_b0,0,0x98);
    iVar6 = sigaction(iVar6,&local_b0,(sigaction *)0x0);
    if (iVar6 != 0) {
      abort();
    }
  }
  else if ((((puVar8->flags & 0x2000000) != 0) && ((handle->flags & 0x2000000) == 0)) &&
          (iVar6 = uv__signal_register_handler(iVar6,1), iVar6 != 0)) {
    __assert_fail("ret == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/signal.c"
                  ,0x235,"void uv__signal_stop(uv_signal_t *)");
  }
  uv__signal_unlock_and_unblock(&saved_sigmask);
  handle->signum = 0;
  uVar2 = handle->flags;
  if (((uVar2 & 4) != 0) && (handle->flags = uVar2 & 0xfffffffb, (uVar2 & 8) != 0)) {
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 - 1;
  }
  return;
}

Assistant:

static void uv__signal_stop(uv_signal_t* handle) {
  uv_signal_t* removed_handle;
  sigset_t saved_sigmask;
  uv_signal_t* first_handle;
  int rem_oneshot;
  int first_oneshot;
  int ret;

  /* If the watcher wasn't started, this is a no-op. */
  if (handle->signum == 0)
    return;

  uv__signal_block_and_lock(&saved_sigmask);

  removed_handle = RB_REMOVE(uv__signal_tree_s, &uv__signal_tree, handle);
  assert(removed_handle == handle);
  (void) removed_handle;

  /* Check if there are other active signal watchers observing this signal. If
   * not, unregister the signal handler.
   */
  first_handle = uv__signal_first_handle(handle->signum);
  if (first_handle == NULL) {
    uv__signal_unregister_handler(handle->signum);
  } else {
    rem_oneshot = handle->flags & UV_SIGNAL_ONE_SHOT;
    first_oneshot = first_handle->flags & UV_SIGNAL_ONE_SHOT;
    if (first_oneshot && !rem_oneshot) {
      ret = uv__signal_register_handler(handle->signum, 1);
      assert(ret == 0);
    }
  }

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signum = 0;
  uv__handle_stop(handle);
}